

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O0

wchar_t archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  char *v_local;
  char *o_local;
  char *m_local;
  archive *_a_local;
  
  if (m == (char *)0x0) {
    _a_local._4_4_ = L'\xffffffec';
  }
  else {
    _a_local._4_4_ = L'\xffffffeb';
  }
  return _a_local._4_4_;
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	(void)_a; /* UNUSED */
	(void)o; /* UNUSED */
	(void)v; /* UNUSED */

	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL)
		return ARCHIVE_WARN - 1;
	return ARCHIVE_WARN;
}